

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_math_min_max(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int64_t *piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 in_XMM0_Qa;
  JSFloat64Union a1;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  JSValue JVar8;
  JSValue val;
  JSValue val_00;
  ulong uStack_60;
  double a;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  if (argc == 0) {
    uVar6 = 0xfff0000000000000;
    if (magic == 0) {
      uVar6 = 0x7ff0000000000000;
    }
    uStack_60 = 7;
    uVar5 = uVar6;
  }
  else if ((int)argv->tag == 0) {
    uVar3 = (argv->u).int32;
    piVar4 = &argv[1].tag;
    for (lVar7 = 1; lVar7 < argc; lVar7 = lVar7 + 1) {
      if ((int)*piVar4 != 0) {
        local_48 = (double)(int)uVar3;
        uStack_40 = in_XMM0_Qa;
        goto LAB_00159f75;
      }
      uVar1 = (((JSValue *)(piVar4 + -1))->u).int32;
      if (magic == 0) {
        if ((int)uVar1 <= (int)uVar3) {
          uVar3 = uVar1;
        }
      }
      else if ((int)uVar3 <= (int)uVar1) {
        uVar3 = uVar1;
      }
      piVar4 = piVar4 + 2;
    }
    uVar6 = 0;
    uStack_60 = 0;
    uVar5 = (ulong)uVar3;
  }
  else {
    val.tag = argv->tag;
    val.u.ptr = (argv->u).ptr;
    iVar2 = JS_ToFloat64(ctx,&local_50,val);
    if (iVar2 == 0) {
      uStack_40 = 0;
      lVar7 = 1;
      local_48 = local_50;
LAB_00159f75:
      piVar4 = &argv[lVar7].tag;
      for (; lVar7 < argc; lVar7 = lVar7 + 1) {
        val_00.tag = *piVar4;
        val_00.u.ptr = ((JSValueUnion *)(piVar4 + -1))->ptr;
        iVar2 = JS_ToFloat64(ctx,&a,val_00);
        if (iVar2 != 0) {
          uVar6 = 0;
          uStack_60 = 6;
          uVar5 = 0;
          goto LAB_0015a05c;
        }
        if (!NAN(local_48)) {
          if (NAN(a)) {
            uStack_40 = 0;
            local_48 = a;
          }
          else if (magic == 0) {
            if (local_48 != 0.0 || a != 0.0) {
              local_48 = fmin(local_48,a);
              uStack_40 = extraout_XMM0_Qb_00;
            }
            else {
              local_48 = (double)((ulong)local_48 | (ulong)a);
            }
          }
          else if (local_48 != 0.0 || a != 0.0) {
            local_48 = fmax(local_48,a);
            uStack_40 = extraout_XMM0_Qb;
          }
          else {
            local_48 = (double)((ulong)local_48 & (ulong)a);
            uStack_40 = 0;
          }
        }
        piVar4 = piVar4 + 2;
      }
      uVar5 = (ulong)local_48 & 0xffffffff;
      uVar6 = (ulong)local_48 & 0xffffffff00000000;
      if (local_48 == (double)(int)local_48) {
        uVar5 = (ulong)(uint)(int)local_48;
        uVar6 = 0;
      }
      uStack_60 = 7;
      if (local_48 == (double)(int)local_48) {
        uStack_60 = 0;
      }
    }
    else {
      uVar6 = 0;
      uStack_60 = 6;
      uVar5 = 0;
    }
  }
LAB_0015a05c:
  JVar8.u.ptr = (void *)(uVar5 & 0xffffffff | uVar6);
  JVar8.tag = uStack_60;
  return JVar8;
}

Assistant:

static JSValue js_math_min_max(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int magic)
{
    BOOL is_max = magic;
    double r, a;
    int i;
    uint32_t tag;

    if (unlikely(argc == 0)) {
        return __JS_NewFloat64(ctx, is_max ? -1.0 / 0.0 : 1.0 / 0.0);
    }

    tag = JS_VALUE_GET_TAG(argv[0]);
    if (tag == JS_TAG_INT) {
        int a1, r1 = JS_VALUE_GET_INT(argv[0]);
        for(i = 1; i < argc; i++) {
            tag = JS_VALUE_GET_TAG(argv[i]);
            if (tag != JS_TAG_INT) {
                r = r1;
                goto generic_case;
            }
            a1 = JS_VALUE_GET_INT(argv[i]);
            if (is_max)
                r1 = max_int(r1, a1);
            else
                r1 = min_int(r1, a1);

        }
        return JS_NewInt32(ctx, r1);
    } else {
        if (JS_ToFloat64(ctx, &r, argv[0]))
            return JS_EXCEPTION;
        i = 1;
    generic_case:
        while (i < argc) {
            if (JS_ToFloat64(ctx, &a, argv[i]))
                return JS_EXCEPTION;
            if (!isnan(r)) {
                if (isnan(a)) {
                    r = a;
                } else {
                    if (is_max)
                        r = js_fmax(r, a);
                    else
                        r = js_fmin(r, a);
                }
            }
            i++;
        }
        return JS_NewFloat64(ctx, r);
    }
}